

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

CURLcode Curl_once_resolved(connectdata *conn,_Bool *protocol_done)

{
  Curl_dns_entry *pCVar1;
  CURLcode CVar2;
  
  pCVar1 = (conn->async).dns;
  if (pCVar1 != (Curl_dns_entry *)0x0) {
    conn->dns_entry = pCVar1;
    (conn->async).dns = (Curl_dns_entry *)0x0;
  }
  CVar2 = Curl_setup_conn(conn,protocol_done);
  if (CVar2 != CURLE_OK) {
    Curl_disconnect(conn->data,conn,true);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_once_resolved(struct connectdata *conn,
                            bool *protocol_done)
{
  CURLcode result;

  if(conn->async.dns) {
    conn->dns_entry = conn->async.dns;
    conn->async.dns = NULL;
  }

  result = Curl_setup_conn(conn, protocol_done);

  if(result)
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(conn->data, conn, TRUE); /* close the connection */

  return result;
}